

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void __thiscall
testing::internal::
FunctionMockerBase<void_(fmt::BasicStringRef<char>,_mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_&,_int)>
::UntypedDescribeUninterestingCall
          (FunctionMockerBase<void_(fmt::BasicStringRef<char>,_mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_&,_int)>
           *this,void *untyped_args,ostream *os)

{
  ostream *poVar1;
  char *pcVar2;
  
  std::operator<<(os,"Uninteresting mock function call - ");
  DescribeDefaultActionTo(this,(ArgumentTuple *)untyped_args,os);
  poVar1 = std::operator<<(os,"    Function call: ");
  pcVar2 = UntypedFunctionMockerBase::Name(&this->super_UntypedFunctionMockerBase);
  std::operator<<(poVar1,pcVar2);
  PrintTupleTo<std::tuple<fmt::BasicStringRef<char>,mp::internal::SolverNLHandlerImpl<TestSolver,StrictMockProblemBuilder,mp::internal::NLProblemBuilder<StrictMockProblemBuilder>>&,int>>
            ((tuple<fmt::BasicStringRef<char>,_mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_&,_int>
              *)untyped_args,os);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    *os << "Uninteresting mock function call - ";
    DescribeDefaultActionTo(args, os);
    *os << "    Function call: " << Name();
    UniversalPrint(args, os);
  }